

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

void render_state_end(render_state_t *state)

{
  float *pfVar1;
  render_state *prVar2;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float b;
  float r;
  float t;
  float l;
  plutovg_rect_t extents;
  plutovg_matrix_t matrix;
  render_state_t *state_local;
  
  if (((state->mode != render_mode_painting) &&
      (pfVar1 = &(state->extents).w, 0.0 < *pfVar1 || *pfVar1 == 0.0)) &&
     (pfVar1 = &(state->extents).h, 0.0 < *pfVar1 || *pfVar1 == 0.0)) {
    plutovg_matrix_invert(&state->parent->matrix,(plutovg_matrix_t *)&extents.w);
    plutovg_matrix_multiply
              ((plutovg_matrix_t *)&extents.w,&state->matrix,(plutovg_matrix_t *)&extents.w);
    plutovg_matrix_map_rect((plutovg_matrix_t *)&extents.w,&state->extents,(plutovg_rect_t *)&t);
    pfVar1 = &(state->parent->extents).w;
    if ((*pfVar1 <= 0.0 && *pfVar1 != 0.0) ||
       (pfVar1 = &(state->parent->extents).h, *pfVar1 <= 0.0 && *pfVar1 != 0.0)) {
      prVar2 = state->parent;
      (prVar2->extents).x = t;
      (prVar2->extents).y = l;
      (prVar2->extents).w = extents.x;
      (prVar2->extents).h = extents.y;
    }
    else {
      if (t <= (state->parent->extents).x) {
        local_4c = t;
      }
      else {
        local_4c = (state->parent->extents).x;
      }
      if (l <= (state->parent->extents).y) {
        local_50 = l;
      }
      else {
        local_50 = (state->parent->extents).y;
      }
      if ((state->parent->extents).x + (state->parent->extents).w <= t + extents.x) {
        local_54 = t + extents.x;
      }
      else {
        local_54 = (state->parent->extents).x + (state->parent->extents).w;
      }
      if ((state->parent->extents).y + (state->parent->extents).h <= l + extents.y) {
        local_58 = l + extents.y;
      }
      else {
        local_58 = (state->parent->extents).y + (state->parent->extents).h;
      }
      (state->parent->extents).x = local_4c;
      (state->parent->extents).y = local_50;
      (state->parent->extents).w = local_54 - local_4c;
      (state->parent->extents).h = local_58 - local_50;
    }
  }
  return;
}

Assistant:

static void render_state_end(render_state_t* state)
{
    if(state->mode == render_mode_painting)
        return;
    if(IS_INVALID_RECT(state->extents)) {
        return;
    }

    plutovg_matrix_t matrix;
    plutovg_matrix_invert(&state->parent->matrix, &matrix);
    plutovg_matrix_multiply(&matrix, &state->matrix, &matrix);

    plutovg_rect_t extents;
    plutovg_matrix_map_rect(&matrix, &state->extents, &extents);
    if(IS_INVALID_RECT(state->parent->extents)) {
        state->parent->extents = extents;
        return;
    }

    float l = MIN(state->parent->extents.x, extents.x);
    float t = MIN(state->parent->extents.y, extents.y);
    float r = MAX(state->parent->extents.x + state->parent->extents.w, extents.x + extents.w);
    float b = MAX(state->parent->extents.y + state->parent->extents.h, extents.y + extents.h);

    state->parent->extents.x = l;
    state->parent->extents.y = t;
    state->parent->extents.w = r - l;
    state->parent->extents.h = b - t;
}